

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<std::vector<bool,_std::allocator<bool>_>_> * __thiscall
Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::operator=
          (OptionBase<std::vector<bool,_std::allocator<bool>_>_> *this,
          OptionBase<std::vector<bool,_std::allocator<bool>_>_> *other)

{
  byte *in_RSI;
  OptionBase<std::vector<bool,_std::allocator<bool>_>_> *in_RDI;
  MaybeUninit<std::vector<bool,_std::allocator<bool>_>_> *this_00;
  EVP_PKEY_CTX local_38 [40];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<std::vector<bool,_std::allocator<bool>_>_> *)0x721827);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x72182f);
  }
  if ((*local_10 & 1) != 0) {
    this_00 = &in_RDI->_elem;
    unwrap((OptionBase<std::vector<bool,_std::allocator<bool>_>_> *)0x721850);
    move_if_value<std::vector<bool,_std::allocator<bool>_>,_true>
              ((vector<bool,_std::allocator<bool>_> *)this_00);
    MaybeUninit<std::vector<bool,_std::allocator<bool>_>_>::init(this_00,local_38);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x721875);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }